

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::cpp_function::destruct(function_record *rec,bool free_strings)

{
  bool bVar1;
  byte in_SIL;
  pointer in_RDI;
  argument_record *arg_1;
  iterator __end3;
  iterator __begin3;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range3;
  argument_record *arg;
  iterator __end4;
  iterator __begin4;
  vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
  *__range4;
  function_record *next;
  pointer in_stack_ffffffffffffff98;
  pointer in_stack_ffffffffffffffa0;
  __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
  local_48;
  undefined1 *local_40;
  reference local_38;
  argument_record *local_30;
  __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
  local_28;
  undefined1 *local_20;
  pointer local_18;
  byte local_9;
  pointer local_8;
  
  local_9 = in_SIL & 1;
  local_8 = in_RDI;
  while (local_8 != (pointer)0x0) {
    local_18 = (pointer)local_8[4].name;
    if (local_8[2].value.m_ptr != (PyObject *)0x0) {
      (*(code *)local_8[2].value.m_ptr)(local_8);
    }
    if ((local_9 & 1) != 0) {
      free((((_Vector_base<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
              *)&local_8->name)->_M_impl).super__Vector_impl_data._M_start);
      free((pointer)local_8->descr);
      free((pointer)(local_8->value).m_ptr);
      local_20 = &local_8->field_0x18;
      local_28._M_current =
           (argument_record *)
           std::
           vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
           ::begin((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                    *)in_stack_ffffffffffffff98);
      local_30 = (argument_record *)
                 std::
                 vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                 ::end((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                        *)in_stack_ffffffffffffff98);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                 *)in_stack_ffffffffffffffa0,
                                (__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                                 *)in_stack_ffffffffffffff98), bVar1) {
        local_38 = __gnu_cxx::
                   __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                   ::operator*(&local_28);
        free(local_38->name);
        free(local_38->descr);
        __gnu_cxx::
        __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
        ::operator++(&local_28);
      }
    }
    local_40 = &local_8->field_0x18;
    local_48._M_current =
         (argument_record *)
         std::
         vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
         ::begin((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
                  *)in_stack_ffffffffffffff98);
    std::
    vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>::
    end((vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>
         *)in_stack_ffffffffffffff98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
                               *)in_stack_ffffffffffffff98), bVar1) {
      __gnu_cxx::
      __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
      ::operator*(&local_48);
      pybind11::handle::dec_ref((handle *)in_stack_ffffffffffffffa0);
      __gnu_cxx::
      __normal_iterator<pybind11::detail::argument_record_*,_std::vector<pybind11::detail::argument_record,_std::allocator<pybind11::detail::argument_record>_>_>
      ::operator++(&local_48);
    }
    if ((pointer)local_8[3].descr != (pointer)0x0) {
      free(*(void **)&((pointer)local_8[3].descr)->field_0x18);
      in_stack_ffffffffffffffa0 = (pointer)local_8[3].descr;
      if (in_stack_ffffffffffffffa0 != (pointer)0x0) {
        operator_delete(in_stack_ffffffffffffffa0,0x20);
      }
    }
    in_stack_ffffffffffffff98 = local_8;
    if (local_8 != (pointer)0x0) {
      pybind11::detail::function_record::~function_record((function_record *)0x266ead);
      operator_delete(in_stack_ffffffffffffff98,0x88);
    }
    local_8 = local_18;
  }
  return;
}

Assistant:

static void destruct(detail::function_record *rec, bool free_strings = true) {
        // If on Python 3.9, check the interpreter "MICRO" (patch) version.
        // If this is running on 3.9.0, we have to work around a bug.
        #if !defined(PYPY_VERSION) && PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION == 9
            static bool is_zero = Py_GetVersion()[4] == '0';
        #endif

        while (rec) {
            detail::function_record *next = rec->next;
            if (rec->free_data)
                rec->free_data(rec);
            // During initialization, these strings might not have been copied yet,
            // so they cannot be freed. Once the function has been created, they can.
            // Check `make_function_record` for more details.
            if (free_strings) {
                std::free((char *) rec->name);
                std::free((char *) rec->doc);
                std::free((char *) rec->signature);
                for (auto &arg: rec->args) {
                    std::free(const_cast<char *>(arg.name));
                    std::free(const_cast<char *>(arg.descr));
                }
            }
            for (auto &arg: rec->args)
                arg.value.dec_ref();
            if (rec->def) {
                std::free(const_cast<char *>(rec->def->ml_doc));
                // Python 3.9.0 decref's these in the wrong order; rec->def
                // If loaded on 3.9.0, let these leak (use Python 3.9.1 at runtime to fix)
                // See https://github.com/python/cpython/pull/22670
                #if !defined(PYPY_VERSION) && PY_MAJOR_VERSION == 3 && PY_MINOR_VERSION == 9
                    if (!is_zero)
                        delete rec->def;
                #else
                    delete rec->def;
                #endif
            }
            delete rec;
            rec = next;
        }
    }